

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

string * __thiscall
deqp::RobustBufferAccessBehavior::ImageLoadStoreTest::getComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,ImageLoadStoreTest *this,VERSION version)

{
  TEST_CASES TVar1;
  size_t sVar2;
  ulong uVar3;
  TestError *pTVar4;
  char *text;
  char *text_00;
  GLchar *pGVar5;
  GLchar *text_01;
  size_t position;
  size_t local_60;
  char *local_58;
  GLchar *local_50;
  GLchar *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  char *local_38;
  
  if (version < (DESTINATION_INVALID|SOURCE_INVALID)) {
    TVar1 = (this->super_TexelFetchTest).m_test_case;
    if (TVar1 < LAST) {
      uVar3 = (ulong)version;
      pGVar5 = *(GLchar **)(&DAT_02115e48 + uVar3 * 8);
      text_01 = *(GLchar **)(&DAT_02115e60 + uVar3 * 8);
      local_38 = 
      "    const TYPE color = imageLoad(uni_source_image, point_source);\n    //imageStore(uni_destination_image, point_destination, vec4(0, 0, 0, 0));\n    imageStore(uni_destination_image, point_destination, color);\n"
      ;
      local_58 = "vec4";
      text_00 = "image2D";
      switch(TVar1) {
      case R8:
        text = "r8";
        break;
      case RG8_SNORM:
        text = "rg8_snorm";
        break;
      case R32UI_MULTISAMPLE:
        local_38 = 
        "    const TYPE color_0 = imageLoad(uni_source_image, point_source, 0 + OFFSET);\n    const TYPE color_1 = imageLoad(uni_source_image, point_source, 1 + OFFSET);\n    const TYPE color_2 = imageLoad(uni_source_image, point_source, 2 + OFFSET);\n    const TYPE color_3 = imageLoad(uni_source_image, point_source, 3 + OFFSET);\n    imageStore(uni_destination_image, point_destination, 0 + OFFSET, color_0);\n    imageStore(uni_destination_image, point_destination, 1 + OFFSET, color_1);\n    imageStore(uni_destination_image, point_destination, 2 + OFFSET, color_2);\n    imageStore(uni_destination_image, point_destination, 3 + OFFSET, color_3);\n"
        ;
        local_58 = "uvec4";
        pGVar5 = "ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";
        text_00 = "uimage2DMS";
        text = "r32ui";
        text_01 = "ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";
        break;
      case RGBA32F:
        text = "rgba32f";
        break;
      case R32UI_MIPMAP:
        local_58 = "uvec4";
        text_00 = "uimage2D";
        text = "r32ui";
      }
      local_50 = *(GLchar **)(&DAT_02115e18 + uVar3 * 8);
      local_48 = *(GLchar **)(&DAT_02115e30 + uVar3 * 8);
      local_60 = 0;
      local_40 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,
                 "#version 430 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 1)        writeonly uniform IMAGE uni_destination_image;\nlayout (location = 0, FORMAT) readonly  uniform IMAGE uni_source_image;\n\nvoid main()\n{\n    const ivec2 point_destination = POINT;\n    const ivec2 point_source      = POINT;\n\nCOPY}\n\n"
                 ,"");
      replaceToken("IMAGE",&local_60,text_00,__return_storage_ptr__);
      replaceToken("FORMAT",&local_60,text,__return_storage_ptr__);
      replaceToken("IMAGE",&local_60,text_00,__return_storage_ptr__);
      replaceToken("POINT",&local_60,pGVar5,__return_storage_ptr__);
      replaceToken("POINT",&local_60,text_01,__return_storage_ptr__);
      sVar2 = local_60;
      replaceToken("COPY",&local_60,local_38,__return_storage_ptr__);
      TVar1 = (this->super_TexelFetchTest).m_test_case;
      local_60 = sVar2;
      if (TVar1 < LAST) {
        if (TVar1 == R32UI_MULTISAMPLE) {
          replaceToken("TYPE",&local_60,local_58,__return_storage_ptr__);
          replaceToken("OFFSET",&local_60,local_48,__return_storage_ptr__);
          replaceToken("TYPE",&local_60,local_58,__return_storage_ptr__);
          replaceToken("OFFSET",&local_60,local_48,__return_storage_ptr__);
          replaceToken("TYPE",&local_60,local_58,__return_storage_ptr__);
          replaceToken("OFFSET",&local_60,local_48,__return_storage_ptr__);
          replaceToken("TYPE",&local_60,local_58,__return_storage_ptr__);
          replaceToken("OFFSET",&local_60,local_48,__return_storage_ptr__);
          replaceToken("OFFSET",&local_60,local_50,__return_storage_ptr__);
          pGVar5 = "OFFSET";
          replaceToken("OFFSET",&local_60,local_50,__return_storage_ptr__);
          replaceToken("OFFSET",&local_60,local_50,__return_storage_ptr__);
        }
        else {
          pGVar5 = "TYPE";
          local_50 = local_58;
        }
        replaceToken(pGVar5,&local_60,local_50,__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                 ,0xa89);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
               ,0xa62);
  }
  else {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
               ,0xa47);
  }
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string ImageLoadStoreTest::getComputeShader(VERSION version)
{
	static const GLchar* template_code = "#version 430 core\n"
										 "\n"
										 "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
										 "\n"
										 "layout (location = 1)        writeonly uniform IMAGE uni_destination_image;\n"
										 "layout (location = 0, FORMAT) readonly  uniform IMAGE uni_source_image;\n"
										 "\n"
										 "void main()\n"
										 "{\n"
										 "    const ivec2 point_destination = POINT;\n"
										 "    const ivec2 point_source      = POINT;\n"
										 "\n"
										 "COPY"
										 "}\n"
										 "\n";

	static const GLchar* copy_multisampled =
		"    const TYPE color_0 = imageLoad(uni_source_image, point_source, 0 + OFFSET);\n"
		"    const TYPE color_1 = imageLoad(uni_source_image, point_source, 1 + OFFSET);\n"
		"    const TYPE color_2 = imageLoad(uni_source_image, point_source, 2 + OFFSET);\n"
		"    const TYPE color_3 = imageLoad(uni_source_image, point_source, 3 + OFFSET);\n"
		"    imageStore(uni_destination_image, point_destination, 0 + OFFSET, color_0);\n"
		"    imageStore(uni_destination_image, point_destination, 1 + OFFSET, color_1);\n"
		"    imageStore(uni_destination_image, point_destination, 2 + OFFSET, color_2);\n"
		"    imageStore(uni_destination_image, point_destination, 3 + OFFSET, color_3);\n";

	static const GLchar* copy_regular =
		"    const TYPE color = imageLoad(uni_source_image, point_source);\n"
		"    //imageStore(uni_destination_image, point_destination, vec4(0, 0, 0, 0));\n"
		"    imageStore(uni_destination_image, point_destination, color);\n";

	static const GLchar* format_r8		  = "r8";
	static const GLchar* format_rg8_snorm = "rg8_snorm";
	static const GLchar* format_rgba32f   = "rgba32f";
	static const GLchar* format_r32ui	 = "r32ui";

	static const GLchar* image_vec4 = "image2D";

	static const GLchar* image_uvec4 = "uimage2D";

	static const GLchar* image_uvec4_ms = "uimage2DMS";

	static const GLchar* offset_invalid = "4";
	static const GLchar* offset_valid   = "0";

	static const GLchar* point_invalid = "ivec2(gl_WorkGroupID.x + 16, gl_WorkGroupID.y + 16)";

	static const GLchar* point_valid = "ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";

	static const GLchar* type_vec4  = "vec4";
	static const GLchar* type_uvec4 = "uvec4";

	const GLchar* copy				 = copy_regular;
	const GLchar* format			 = format_r8;
	const GLchar* image				 = image_vec4;
	const GLchar* offset_destination = offset_valid;
	const GLchar* offset_source		 = offset_valid;
	const GLchar* point_destination  = point_valid;
	const GLchar* point_source		 = point_valid;
	const GLchar* type				 = type_vec4;

	switch (version)
	{
	case VALID:
		break;
	case SOURCE_INVALID:
		point_source  = point_invalid;
		offset_source = offset_invalid;
		break;
	case DESTINATION_INVALID:
		point_destination  = point_invalid;
		offset_destination = offset_invalid;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	switch (m_test_case)
	{
	case R8:
		break;
	case RG8_SNORM:
		format = format_rg8_snorm;
		break;
	case RGBA32F:
		format = format_rgba32f;
		break;
	case R32UI_MIPMAP:
		format = format_r32ui;
		image  = image_uvec4;
		type   = type_uvec4;
		break;
	case R32UI_MULTISAMPLE:
		copy			  = copy_multisampled;
		format			  = format_r32ui;
		image			  = image_uvec4_ms;
		point_destination = point_valid;
		point_source	  = point_valid;
		type			  = type_uvec4;
		break;
	default:
		TCU_FAIL("Invalid enum");
	};

	size_t		position = 0;
	std::string source   = template_code;

	replaceToken("IMAGE", position, image, source);
	replaceToken("FORMAT", position, format, source);
	replaceToken("IMAGE", position, image, source);
	replaceToken("POINT", position, point_destination, source);
	replaceToken("POINT", position, point_source, source);

	size_t temp_position = position;
	replaceToken("COPY", position, copy, source);
	position = temp_position;

	switch (m_test_case)
	{
	case R8:
	case RG8_SNORM:
	case RGBA32F:
	case R32UI_MIPMAP:
		replaceToken("TYPE", position, type, source);
		break;
	case R32UI_MULTISAMPLE:
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("OFFSET", position, offset_destination, source);
		replaceToken("OFFSET", position, offset_destination, source);
		replaceToken("OFFSET", position, offset_destination, source);
		replaceToken("OFFSET", position, offset_destination, source);
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return source;
}